

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __type _Var1;
  bool bVar2;
  int iVar3;
  TargetType targetType;
  size_type sVar4;
  pointer pcVar5;
  cmState *this_00;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a8;
  cmStateSnapshot local_418;
  cmStateDirectory local_400;
  byte local_3d1;
  char *pcStack_3d0;
  bool chain;
  char *retVal;
  cmStateDirectory local_3b0;
  cmStateSnapshot local_388;
  cmStateDirectory local_370;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_243;
  key_equal local_242;
  hasher local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  iterator local_58;
  size_type local_50;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  string *local_20;
  string *prop_local;
  cmTarget *this_local;
  
  local_20 = prop;
  prop_local = (string *)this;
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_LIBRARIES_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES",&local_21);
    std::allocator<char>::~allocator(&local_21);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_),
     iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,"TYPE",
               local_35);
    std::allocator<char>::~allocator(local_35);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
               "INCLUDE_DIRECTORIES",&local_36);
    std::allocator<char>::~allocator(&local_36);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_FEATURES_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
               "COMPILE_FEATURES",&local_37);
    std::allocator<char>::~allocator(&local_37);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_OPTIONS_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
               "COMPILE_OPTIONS",&local_38);
    std::allocator<char>::~allocator(&local_38);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
               "COMPILE_DEFINITIONS",&local_39);
    std::allocator<char>::~allocator(&local_39);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_OPTIONS_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_,
               "LINK_OPTIONS",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_DIRECTORIES_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_,
               "LINK_DIRECTORIES",&local_3b);
    std::allocator<char>::~allocator(&local_3b);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_
                                 ), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,
               "IMPORTED",&local_3c);
    std::allocator<char>::~allocator(&local_3c);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propIMPORTED_GLOBAL_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_,
               "IMPORTED_GLOBAL",&local_3d);
    std::allocator<char>::~allocator(&local_3d);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0')
     && (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
               ,"MANUALLY_ADDED_DEPENDENCIES",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_),
     iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,"NAME",
               &local_3f);
    std::allocator<char>::~allocator(&local_3f);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propBINARY_DIR_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,
               "BINARY_DIR",&local_40);
    std::allocator<char>::~allocator(&local_40);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propSOURCE_DIR_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,
               "SOURCE_DIR",&local_41);
    std::allocator<char>::~allocator(&local_41);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_)
     , iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,"SOURCES"
               ,&local_42);
    std::allocator<char>::~allocator(&local_42);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar3 != 0)) {
    local_240 = &local_238;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)
               &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_)
    ;
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_)
    ;
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)
               &GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
              );
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
    std::__cxx11::string::string
              ((string *)local_240,
               (string *)&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_);
    local_58 = &local_238;
    local_50 = 0xf;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_243);
    __l._M_len = local_50;
    __l._M_array = local_58;
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,__l,0,
                    &local_241,&local_242,&local_243);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_243);
    local_4a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
    do {
      local_4a8 = local_4a8 + -1;
      std::__cxx11::string::~string((string *)local_4a8);
    } while (local_4a8 != &local_238);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  sVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,local_20);
  if (sVar4 != 0) {
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propLINK_LIBRARIES_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->LinkImplementationPropertyEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_268,&pcVar5->LinkImplementationPropertyEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        return pcVar6;
      }
      return (char *)0x0;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_)
    ;
    if (_Var1) {
      targetType = GetType(this);
      pcVar6 = cmState::GetTargetTypeName(targetType);
      return pcVar6;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propINCLUDE_DIRECTORIES_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->IncludeDirectoriesEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_288,&pcVar5->IncludeDirectoriesEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        return pcVar6;
      }
      return (char *)0x0;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propCOMPILE_FEATURES_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->CompileFeaturesEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_2a8,&pcVar5->CompileFeaturesEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        return pcVar6;
      }
      return (char *)0x0;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propCOMPILE_OPTIONS_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->CompileOptionsEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_2c8,&pcVar5->CompileOptionsEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        return pcVar6;
      }
      return (char *)0x0;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propCOMPILE_DEFINITIONS_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->CompileDefinitionsEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_2e8,&pcVar5->CompileDefinitionsEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        return pcVar6;
      }
      return (char *)0x0;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propLINK_OPTIONS_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->LinkOptionsEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_308,&pcVar5->LinkOptionsEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        return pcVar6;
      }
      return (char *)0x0;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propLINK_DIRECTORIES_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar5->LinkDirectoriesEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_328,&pcVar5->LinkDirectoriesEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_328);
        std::__cxx11::string::~string((string *)&local_328);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        return pcVar6;
      }
      return (char *)0x0;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      bVar2 = std::
              set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&pcVar5->Utilities);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          std::__cxx11::string::string
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        cmJoin<std::set<BT<std::__cxx11::string>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_348,&pcVar5->Utilities,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        return pcVar6;
      }
      return (char *)0x0;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propIMPORTED_abi_cxx11_);
    if (_Var1) {
      bVar2 = IsImported(this);
      if (!bVar2) {
        return "FALSE";
      }
      return "TRUE";
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propIMPORTED_GLOBAL_abi_cxx11_);
    if (_Var1) {
      bVar2 = IsImportedGloballyVisible(this);
      if (!bVar2) {
        return "FALSE";
      }
      return "TRUE";
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_)
    ;
    if (_Var1) {
      GetName_abi_cxx11_(this);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      return pcVar6;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propBINARY_DIR_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmMakefile::GetStateSnapshot(&local_388,pcVar5->Makefile);
      cmStateSnapshot::GetDirectory(&local_370,&local_388);
      cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_370);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      return pcVar6;
    }
    _Var1 = std::operator==(local_20,&GetProperty(std::__cxx11::string_const&)::
                                      propSOURCE_DIR_abi_cxx11_);
    if (_Var1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmMakefile::GetStateSnapshot((cmStateSnapshot *)&retVal,pcVar5->Makefile);
      cmStateSnapshot::GetDirectory(&local_3b0,(cmStateSnapshot *)&retVal);
      cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_3b0);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      return pcVar6;
    }
  }
  pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  pcStack_3d0 = cmPropertyMap::GetPropertyValue(&pcVar5->Properties,local_20);
  if (pcStack_3d0 == (char *)0x0) {
    pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    this_00 = cmMakefile::GetState(pcVar5->Makefile);
    local_3d1 = cmState::IsPropertyChained(this_00,local_20,TARGET);
    if ((bool)local_3d1) {
      pcVar5 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmMakefile::GetStateSnapshot(&local_418,pcVar5->Makefile);
      cmStateSnapshot::GetDirectory(&local_400,&local_418);
      pcVar6 = cmStateDirectory::GetProperty(&local_400,local_20,(bool)(local_3d1 & 1));
      return pcVar6;
    }
  }
  return pcStack_3d0;
}

Assistant:

const char* cmTarget::GetProperty(const std::string& prop) const
{
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(BINARY_DIR);
  MAKE_STATIC_PROP(SOURCE_DIR);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  static std::unordered_set<std::string> const specialProps{
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES
  };
  if (specialProps.count(prop)) {
    if (prop == propLINK_LIBRARIES) {
      if (impl->LinkImplementationPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->LinkImplementationPropertyEntries, ";");
      return output.c_str();
    }
    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmState::GetTargetTypeName(this->GetType());
    }
    if (prop == propINCLUDE_DIRECTORIES) {
      if (impl->IncludeDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->IncludeDirectoriesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_FEATURES) {
      if (impl->CompileFeaturesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->CompileFeaturesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_OPTIONS) {
      if (impl->CompileOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->CompileOptionsEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_DEFINITIONS) {
      if (impl->CompileDefinitionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->CompileDefinitionsEntries, ";");
      return output.c_str();
    }
    if (prop == propLINK_OPTIONS) {
      if (impl->LinkOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->LinkOptionsEntries, ";");
      return output.c_str();
    }
    if (prop == propLINK_DIRECTORIES) {
      if (impl->LinkDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->LinkDirectoriesEntries, ";");

      return output.c_str();
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->Utilities, ";");
      return output.c_str();
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? "TRUE" : "FALSE";
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? "TRUE" : "FALSE";
    }
    if (prop == propNAME) {
      return this->GetName().c_str();
    }
    if (prop == propBINARY_DIR) {
      return impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentBinary()
        .c_str();
    }
    if (prop == propSOURCE_DIR) {
      return impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentSource()
        .c_str();
    }
  }

  const char* retVal = impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain =
      impl->Makefile->GetState()->IsPropertyChained(prop, cmProperty::TARGET);
    if (chain) {
      return impl->Makefile->GetStateSnapshot().GetDirectory().GetProperty(
        prop, chain);
    }
  }
  return retVal;
}